

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

void __thiscall cmCTestScriptHandler::CreateCMake(cmCTestScriptHandler *this)

{
  unique_ptr<cmake,_std::default_delete<cmake>_> *this_00;
  cmake *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *this_01;
  undefined8 uVar3;
  int recursionDepth;
  string cwd;
  cmStateSnapshot snapshot;
  allocator<char> local_111;
  undefined1 local_110 [8];
  undefined1 local_108 [40];
  _Head_base<0UL,_cmCTestCommand_*,_false> local_e0;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_d8;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_d0;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_c8;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_c0;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_b8;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_b0;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_a8;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_a0;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_98;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_90;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_88;
  _Head_base<0UL,_cmCTestCommand_*,_false> local_80;
  string local_78;
  cmStateSnapshot local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_78._M_dataplus._M_p._0_4_ = 1;
  local_58.State = (cmState *)CONCAT44(local_58.State._4_4_,4);
  std::make_unique<cmake,cmake::Role,cmState::Mode>((Role *)local_108,(Mode *)&local_78);
  uVar3 = local_108._0_8_;
  this_00 = &this->CMake;
  local_108._0_8_ = (__uniq_ptr_impl<cmake,_std::default_delete<cmake>_>)0x0;
  std::__uniq_ptr_impl<cmake,_std::default_delete<cmake>_>::reset
            ((__uniq_ptr_impl<cmake,_std::default_delete<cmake>_> *)this_00,(pointer)uVar3);
  std::unique_ptr<cmake,_std::default_delete<cmake>_>::~unique_ptr
            ((unique_ptr<cmake,_std::default_delete<cmake>_> *)local_108);
  pcVar1 = (this->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
           super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"",(allocator<char> *)&local_78);
  cmake::SetHomeDirectory(pcVar1,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  pcVar1 = (this_00->_M_t).super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
           super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"",(allocator<char> *)&local_78);
  cmake::SetHomeOutputDirectory(pcVar1,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  pcVar1 = (this->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
           super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  local_108._16_8_ = (pcVar1->CurrentSnapshot).Position.Position;
  local_108._0_8_ = (pcVar1->CurrentSnapshot).State;
  local_108._8_8_ = (pcVar1->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_108);
  cmake::AddCMakePaths
            ((this->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
             super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl);
  local_78._M_dataplus._M_p =
       (pointer)(this->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  std::make_unique<cmGlobalGenerator,cmake*>((cmake **)local_108);
  uVar3 = local_108._0_8_;
  local_108._0_8_ = (cmake *)0x0;
  pcVar2 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  (this->GlobalGenerator)._M_t.
  super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)uVar3;
  if (pcVar2 != (cmGlobalGenerator *)0x0) {
    (*pcVar2->_vptr_cmGlobalGenerator[1])();
    if ((cmake *)local_108._0_8_ != (cmake *)0x0) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
  }
  pcVar1 = (this_00->_M_t).super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
           super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  local_58.Position.Position = (pcVar1->CurrentSnapshot).Position.Position;
  local_58.State = (pcVar1->CurrentSnapshot).State;
  local_58.Position.Tree = (pcVar1->CurrentSnapshot).Position.Tree;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_108,&local_58);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_108,&local_78);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_108,&local_58);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_108,&local_78);
  local_110 = (undefined1  [8])
              (this->GlobalGenerator)._M_t.
              super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t
              .super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
              super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  std::make_unique<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
            ((cmGlobalGenerator **)local_108,(cmStateSnapshot *)local_110);
  uVar3 = local_108._0_8_;
  local_108._0_8_ = (__uniq_ptr_impl<cmake,_std::default_delete<cmake>_>)0x0;
  std::__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>::reset
            ((__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> *)&this->Makefile,
             (pointer)uVar3);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)local_108);
  if (this->ParentMakefile != (cmMakefile *)0x0) {
    this_01 = (this->Makefile)._M_t.
              super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
              super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
              super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
    recursionDepth = cmMakefile::GetRecursionDepth(this->ParentMakefile);
    cmMakefile::SetRecursionDepth(this_01,recursionDepth);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx:245:5)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx:245:5)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  cmake::SetProgressCallback
            ((this->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
             super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl,(ProgressCallbackType *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"ctest_build",&local_111);
  std::make_unique<cmCTestBuildCommand>();
  local_a0._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_a0);
  if ((cmGlobalGenerator *)local_a0._M_head_impl != (cmGlobalGenerator *)0x0) {
    (*((local_a0._M_head_impl)->super_cmCommand)._vptr_cmCommand[1])();
  }
  local_a0._M_head_impl = (cmCTestCommand *)0x0;
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"ctest_configure",&local_111);
  std::make_unique<cmCTestConfigureCommand>();
  local_a8._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_a8);
  if ((cmState *)local_a8._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_a8._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  local_a8._M_head_impl = (cmCTestCommand *)0x0;
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"ctest_coverage",&local_111);
  std::make_unique<cmCTestCoverageCommand>();
  local_b0._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_b0);
  if ((cmState *)local_b0._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_b0._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  local_b0._M_head_impl = (cmCTestCommand *)0x0;
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"ctest_empty_binary_directory",&local_111);
  std::make_unique<cmCTestEmptyBinaryDirectoryCommand>();
  local_b8._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_b8);
  if ((cmState *)local_b8._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_b8._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  local_b8._M_head_impl = (cmCTestCommand *)0x0;
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"ctest_memcheck",&local_111);
  std::make_unique<cmCTestMemCheckCommand>();
  local_c0._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_c0);
  if ((cmState *)local_c0._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_c0._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  local_c0._M_head_impl = (cmCTestCommand *)0x0;
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"ctest_read_custom_files",&local_111);
  std::make_unique<cmCTestReadCustomFilesCommand>();
  local_c8._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_c8);
  if ((cmState *)local_c8._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_c8._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  local_c8._M_head_impl = (cmCTestCommand *)0x0;
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"ctest_run_script",&local_111);
  std::make_unique<cmCTestRunScriptCommand>();
  local_d0._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_d0);
  if ((cmState *)local_d0._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_d0._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  local_d0._M_head_impl = (cmCTestCommand *)0x0;
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"ctest_sleep",&local_111);
  std::make_unique<cmCTestSleepCommand>();
  local_d8._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_d8);
  if ((cmState *)local_d8._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_d8._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  local_d8._M_head_impl = (cmCTestCommand *)0x0;
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"ctest_start",&local_111);
  std::make_unique<cmCTestStartCommand>();
  local_e0._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_e0);
  if ((cmState *)local_e0._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_e0._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  local_e0._M_head_impl = (cmCTestCommand *)0x0;
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"ctest_submit",&local_111);
  std::make_unique<cmCTestSubmitCommand>();
  local_80._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_80);
  if ((cmState *)local_80._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_80._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"ctest_test",&local_111);
  std::make_unique<cmCTestTestCommand>();
  local_88._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_88);
  if ((cmState *)local_88._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_88._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"ctest_update",&local_111);
  std::make_unique<cmCTestUpdateCommand>();
  local_90._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_90);
  if ((cmState *)local_90._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_90._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"ctest_upload",&local_111);
  std::make_unique<cmCTestUploadCommand>();
  local_98._M_head_impl = (cmCTestCommand *)local_110;
  local_110 = (undefined1  [8])0x0;
  AddCTestCommand(this,(string *)local_108,
                  (unique_ptr<cmCTestCommand,_std::default_delete<cmCTestCommand>_> *)&local_98);
  if ((cmState *)local_98._M_head_impl != (cmState *)0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)&(local_98._M_head_impl)->super_cmCommand)->
                           Map_)._M_t._M_impl + 8))();
  }
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)&(((cmPropertyDefinitionMap *)local_110)->Map_)._M_t._M_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void cmCTestScriptHandler::CreateCMake()
{
  // create a cmake instance to read the configuration script
  this->CMake = cm::make_unique<cmake>(cmake::RoleScript, cmState::CTest);
  this->CMake->SetHomeDirectory("");
  this->CMake->SetHomeOutputDirectory("");
  this->CMake->GetCurrentSnapshot().SetDefaultDefinitions();
  this->CMake->AddCMakePaths();
  this->GlobalGenerator =
    cm::make_unique<cmGlobalGenerator>(this->CMake.get());

  cmStateSnapshot snapshot = this->CMake->GetCurrentSnapshot();
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  snapshot.GetDirectory().SetCurrentSource(cwd);
  snapshot.GetDirectory().SetCurrentBinary(cwd);
  this->Makefile =
    cm::make_unique<cmMakefile>(this->GlobalGenerator.get(), snapshot);
  if (this->ParentMakefile) {
    this->Makefile->SetRecursionDepth(
      this->ParentMakefile->GetRecursionDepth());
  }

  this->CMake->SetProgressCallback(
    [this](const std::string& m, float /*unused*/) {
      if (!m.empty()) {
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "-- " << m << std::endl);
      }
    });

  this->AddCTestCommand("ctest_build", cm::make_unique<cmCTestBuildCommand>());
  this->AddCTestCommand("ctest_configure",
                        cm::make_unique<cmCTestConfigureCommand>());
  this->AddCTestCommand("ctest_coverage",
                        cm::make_unique<cmCTestCoverageCommand>());
  this->AddCTestCommand("ctest_empty_binary_directory",
                        cm::make_unique<cmCTestEmptyBinaryDirectoryCommand>());
  this->AddCTestCommand("ctest_memcheck",
                        cm::make_unique<cmCTestMemCheckCommand>());
  this->AddCTestCommand("ctest_read_custom_files",
                        cm::make_unique<cmCTestReadCustomFilesCommand>());
  this->AddCTestCommand("ctest_run_script",
                        cm::make_unique<cmCTestRunScriptCommand>());
  this->AddCTestCommand("ctest_sleep", cm::make_unique<cmCTestSleepCommand>());
  this->AddCTestCommand("ctest_start", cm::make_unique<cmCTestStartCommand>());
  this->AddCTestCommand("ctest_submit",
                        cm::make_unique<cmCTestSubmitCommand>());
  this->AddCTestCommand("ctest_test", cm::make_unique<cmCTestTestCommand>());
  this->AddCTestCommand("ctest_update",
                        cm::make_unique<cmCTestUpdateCommand>());
  this->AddCTestCommand("ctest_upload",
                        cm::make_unique<cmCTestUploadCommand>());
}